

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtreewidget.cpp
# Opt level: O0

void __thiscall QTreeWidgetPrivate::emitItemClicked(QTreeWidgetPrivate *this,QModelIndex *index)

{
  QTreeWidgetItem *_t1;
  QModelIndex *in_RSI;
  QTreeWidgetPrivate *in_RDI;
  QTreeWidget *q;
  QModelIndex *in_stack_ffffffffffffffc8;
  int _t2;
  
  _t1 = (QTreeWidgetItem *)q_func(in_RDI);
  item(in_RDI,in_stack_ffffffffffffffc8);
  _t2 = (int)((ulong)in_RDI >> 0x20);
  QModelIndex::column(in_RSI);
  QTreeWidget::itemClicked((QTreeWidget *)in_stack_ffffffffffffffc8,_t1,_t2);
  return;
}

Assistant:

void QTreeWidgetPrivate::emitItemClicked(const QModelIndex &index)
{
    Q_Q(QTreeWidget);
    emit q->itemClicked(item(index), index.column());
}